

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::save_load_node
               (node *cn,io_buf *model_file,bool *read,bool *text,stringstream *msg)

{
  stringstream *psVar1;
  bool *pbVar2;
  uint uVar3;
  ostream *poVar4;
  v_array<unsigned_int> *this;
  uint32_t k;
  ulong uVar5;
  size_t leaf_n_examples;
  uint local_4c;
  bool *local_48;
  stringstream *local_40;
  stringstream *local_38;
  
  psVar1 = msg + 0x10;
  poVar4 = std::operator<<((ostream *)psVar1,"parent");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," ");
  local_48 = read;
  bin_text_read_write_fixed(model_file,(char *)cn,4,"",*read,msg,*text);
  poVar4 = std::operator<<((ostream *)psVar1,"internal");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,cn->internal);
  std::operator<<(poVar4," ");
  bin_text_read_write_fixed(model_file,(char *)&cn->internal,4,"",*read,msg,*text);
  poVar4 = std::operator<<((ostream *)psVar1,"depth");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," ");
  pbVar2 = local_48;
  bin_text_read_write_fixed(model_file,(char *)&cn->depth,4,"",*local_48,msg,*text);
  poVar4 = std::operator<<((ostream *)psVar1,"base_router");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," ");
  bin_text_read_write_fixed(model_file,(char *)&cn->base_router,4,"",*pbVar2,msg,*text);
  poVar4 = std::operator<<((ostream *)psVar1,"left");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," ");
  pbVar2 = local_48;
  local_40 = msg;
  bin_text_read_write_fixed(model_file,(char *)&cn->left,4,"",*local_48,msg,*text);
  poVar4 = std::operator<<((ostream *)psVar1,"right");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," ");
  bin_text_read_write_fixed(model_file,(char *)&cn->right,4,"",*pbVar2,msg,*text);
  local_38 = psVar1;
  poVar4 = std::operator<<((ostream *)psVar1,"nl");
  std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<double>(cn->nl);
  std::operator<<(poVar4," ");
  bin_text_read_write_fixed(model_file,(char *)&cn->nl,8,"",*pbVar2,local_40,*text);
  poVar4 = std::operator<<((ostream *)psVar1,"nr");
  std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<double>(cn->nr);
  std::operator<<(poVar4," ");
  psVar1 = local_40;
  bin_text_read_write_fixed(model_file,(char *)&cn->nr,8,"",*pbVar2,local_40,*text);
  this = &cn->examples_index;
  leaf_n_examples = (long)(cn->examples_index)._end - (long)(cn->examples_index)._begin >> 2;
  poVar4 = std::operator<<((ostream *)local_38,"leaf_n_examples");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," ");
  bin_text_read_write_fixed(model_file,(char *)&leaf_n_examples,8,"",*pbVar2,psVar1,*text);
  if (*pbVar2 != false) {
    v_array<unsigned_int>::clear(this);
    for (uVar5 = 0; uVar5 < leaf_n_examples; uVar5 = (ulong)((int)uVar5 + 1)) {
      local_4c = 0;
      v_array<unsigned_int>::push_back(this,&local_4c);
    }
  }
  for (uVar3 = 0; uVar3 < leaf_n_examples; uVar3 = uVar3 + 1) {
    poVar4 = std::operator<<((ostream *)local_38,"example_location");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4," ");
    bin_text_read_write_fixed(model_file,(char *)(this->_begin + uVar3),4,"",*pbVar2,psVar1,*text);
  }
  return;
}

Assistant:

void save_load_node(node& cn, io_buf& model_file, bool& read, bool& text, stringstream& msg)
    {
        writeit(cn.parent, "parent");
        writeit(cn.internal, "internal");
        writeit(cn.depth, "depth");
        writeit(cn.base_router, "base_router");
        writeit(cn.left, "left");
        writeit(cn.right, "right");
        writeit(cn.nl, "nl");
        writeit(cn.nr, "nr");
        writeitvar(cn.examples_index.size(), "leaf_n_examples", leaf_n_examples);
        if (read){
            cn.examples_index.clear();
            for (uint32_t k = 0; k < leaf_n_examples; k++)
                    cn.examples_index.push_back(0);
        }
        for (uint32_t k = 0; k < leaf_n_examples; k++)
            writeit(cn.examples_index[k], "example_location");
    }